

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

void Fra_ClauReduceClause(Vec_Int_t *vMain,Vec_Int_t *vNew)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_34;
  int local_30;
  int k;
  int j;
  int i;
  int VarN;
  int VarM;
  int LitN;
  int LitM;
  Vec_Int_t *vNew_local;
  Vec_Int_t *vMain_local;
  
  iVar2 = Vec_IntSize(vMain);
  iVar3 = Vec_IntSize(vNew);
  if (iVar3 < iVar2) {
    __assert_fail("Vec_IntSize(vMain) <= Vec_IntSize(vNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,0x1dc,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
  }
  local_34 = 0;
  local_30 = 0;
  k = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vMain);
    bVar1 = false;
    if (k < iVar2) {
      iVar2 = Vec_IntSize(vNew);
      bVar1 = local_30 < iVar2;
    }
    if (!bVar1) break;
    iVar2 = Vec_IntEntry(vMain,k);
    iVar3 = Vec_IntEntry(vNew,local_30);
    iVar4 = lit_var(iVar2);
    iVar5 = lit_var(iVar3);
    if (iVar4 < iVar5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                    ,0x1e5,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
    }
    if ((iVar4 <= iVar5) && (k = k + 1, iVar2 == iVar3)) {
      Vec_IntWriteEntry(vMain,local_34,iVar2);
      local_34 = local_34 + 1;
    }
    local_30 = local_30 + 1;
  }
  iVar2 = Vec_IntSize(vMain);
  if (k != iVar2) {
    __assert_fail("i == Vec_IntSize(vMain)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,499,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntShrink(vMain,local_34);
  return;
}

Assistant:

void Fra_ClauReduceClause( Vec_Int_t * vMain, Vec_Int_t * vNew )
{
    int LitM, LitN, VarM, VarN, i, j, k;
    assert( Vec_IntSize(vMain) <= Vec_IntSize(vNew) );
    for ( i = j = k = 0; i < Vec_IntSize(vMain) && j < Vec_IntSize(vNew); )
    {
        LitM = Vec_IntEntry( vMain, i );
        LitN = Vec_IntEntry( vNew, j );
        VarM = lit_var( LitM );
        VarN = lit_var( LitN );
        if ( VarM < VarN )
        {
            assert( 0 );
        }
        else if ( VarM > VarN )
        {
            j++;
        }
        else // if ( VarM == VarN )
        {
            i++;
            j++;
            if ( LitM == LitN )
                Vec_IntWriteEntry( vMain, k++, LitM );
        }
    }
    assert( i == Vec_IntSize(vMain) );
    Vec_IntShrink( vMain, k );
}